

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::Call::Call<>(Call *this,string *funcName)

{
  allocator<std::shared_ptr<mocker::ir::Addr>_> local_39;
  initializer_list<std::shared_ptr<mocker::ir::Addr>_> local_38;
  shared_ptr<mocker::ir::Reg> local_28;
  string *local_18;
  string *funcName_local;
  Call *this_local;
  
  local_18 = funcName;
  funcName_local = (string *)this;
  IRInst::IRInst(&this->super_IRInst,Call);
  std::shared_ptr<mocker::ir::Reg>::shared_ptr(&local_28,(nullptr_t)0x0);
  Definition::Definition(&this->super_Definition,&local_28);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_28);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_0039b2b0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_0039b2d0;
  std::__cxx11::string::string((string *)&this->funcName,(string *)funcName);
  std::initializer_list<std::shared_ptr<mocker::ir::Addr>_>::initializer_list(&local_38);
  std::allocator<std::shared_ptr<mocker::ir::Addr>_>::allocator(&local_39);
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  vector(&this->args,local_38,&local_39);
  std::allocator<std::shared_ptr<mocker::ir::Addr>_>::~allocator(&local_39);
  return;
}

Assistant:

explicit Call(std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(nullptr),
        funcName(std::move(funcName)), args({std::move(args)...}) {}